

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjPlaneHeight(int componentID,int height,int subsamp)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  
  if (((height < 1 || 5 < (uint)subsamp) || (componentID < 0)) ||
     ((uint)(subsamp != 3) * 2 + 1 <= (uint)componentID)) {
    pcVar3 = (char *)__tls_get_addr(&PTR_00199f20);
    builtin_strncpy(pcVar3,"tjPlaneHeight(): Invalid argument",0x22);
    uVar2 = 0xffffffff;
  }
  else {
    iVar1 = tjMCUHeight[(uint)subsamp] / 8;
    uVar2 = -iVar1 & (height + iVar1) - 1U;
    if (componentID != 0) {
      uVar2 = (int)(uVar2 << 3) / tjMCUHeight[(uint)subsamp];
    }
  }
  return uVar2;
}

Assistant:

DLLEXPORT int tjPlaneHeight(int componentID, int height, int subsamp)
{
  int ph, nc, retval = 0;

  if (height < 1 || subsamp < 0 || subsamp >= TJ_NUMSAMP)
    THROWG("tjPlaneHeight(): Invalid argument");
  nc = (subsamp == TJSAMP_GRAY ? 1 : 3);
  if (componentID < 0 || componentID >= nc)
    THROWG("tjPlaneHeight(): Invalid argument");

  ph = PAD(height, tjMCUHeight[subsamp] / 8);
  if (componentID == 0)
    retval = ph;
  else
    retval = ph * 8 / tjMCUHeight[subsamp];

bailout:
  return retval;
}